

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

TypeID __thiscall
spirv_cross::CompilerGLSL::get_composite_member_type
          (CompilerGLSL *this,TypeID type_id,uint32_t member_idx)

{
  bool bVar1;
  SPIRType *type;
  CompilerError *this_00;
  TypeID *pTVar2;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    type_id.id);
  bVar1 = Compiler::is_array(&this->super_Compiler,type);
  if (!bVar1) {
    if (type->basetype == Struct) {
      pTVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               ptr + member_idx;
      goto LAB_002d9f05;
    }
    bVar1 = Compiler::is_matrix(&this->super_Compiler,type);
    if (!bVar1) {
      bVar1 = Compiler::is_vector(&this->super_Compiler,type);
      if (!bVar1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,
                   "Shouldn\'t reach lower than vector handling OpSpecConstantOp CompositeInsert!");
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  pTVar2 = &type->parent_type;
LAB_002d9f05:
  return (TypeID)pTVar2->id;
}

Assistant:

TypeID CompilerGLSL::get_composite_member_type(TypeID type_id, uint32_t member_idx)
{
	auto &type = get<SPIRType>(type_id);
	if (is_array(type))
		return type.parent_type;
	if (type.basetype == SPIRType::Struct)
		return type.member_types[member_idx];
	if (is_matrix(type))
		return type.parent_type;
	if (is_vector(type))
		return type.parent_type;
	SPIRV_CROSS_THROW("Shouldn't reach lower than vector handling OpSpecConstantOp CompositeInsert!");
}